

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadString(CrateReader *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  value_type *this_00;
  string *psVar3;
  long lVar4;
  string local_528;
  ostringstream local_508 [8];
  ostringstream ss_e_2;
  string local_388;
  ostringstream local_368 [8];
  ostringstream ss_e_1;
  undefined1 local_1e8 [8];
  optional<tinyusdz::Token> tok;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  Index local_24;
  string *psStack_20;
  Index string_index;
  string *s_local;
  CrateReader *this_local;
  
  psStack_20 = s;
  Index::Index(&local_24);
  bVar1 = ReadIndex(this,&local_24);
  if (bVar1) {
    GetStringToken((optional<tinyusdz::Token> *)local_1e8,this,local_24);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1e8);
    if (bVar1) {
      this_00 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                          ((optional<tinyusdz::Token> *)local_1e8);
      psVar3 = Token::str_abi_cxx11_(this_00);
      ::std::__cxx11::string::operator=((string *)psStack_20,(string *)psVar3);
      lVar4 = ::std::__cxx11::string::size();
      this->_memoryUsage = lVar4 + this->_memoryUsage;
      if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
        ::std::__cxx11::ostringstream::ostringstream(local_368);
        poVar2 = ::std::operator<<((ostream *)local_368,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadString");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xff);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_368,"Reached to max memory budget.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_388);
        ::std::__cxx11::string::~string((string *)&local_388);
        this_local._7_1_ = 0;
        bVar1 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_368);
      }
      else {
        this_local._7_1_ = 1;
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional
              ((optional<tinyusdz::Token> *)local_1e8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_508);
      poVar2 = ::std::operator<<((ostream *)local_508,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadString");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x104);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_508,"Invalid StringIndex.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_528);
      ::std::__cxx11::string::~string((string *)&local_528);
      ::std::__cxx11::ostringstream::~ostringstream(local_508);
      this_local._7_1_ = 0;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadString");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xf9);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read Index for string data.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)((long)&tok.contained + 0x18));
    ::std::__cxx11::string::~string((string *)((long)&tok.contained + 0x18));
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadString(std::string *s) {
  // string is serialized as StringIndex
  crate::Index string_index;
  if (!ReadIndex(&string_index)) {
    PUSH_ERROR("Failed to read Index for string data.");
    return false;
  }

  if (auto tok = GetStringToken(string_index)) {
    (*s) = tok.value().str();
    CHECK_MEMORY_USAGE(s->size());
    return true;
  }


  PUSH_ERROR("Invalid StringIndex.");
  return false;
}